

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uefitool.cpp
# Opt level: O0

void __thiscall UEFITool::search(UEFITool *this)

{
  FfsFinder *this_00;
  bool bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  QByteArray *a;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  UINT8 local_e9;
  undefined1 local_e8 [7];
  UINT8 mode_2;
  QString pattern_2;
  undefined1 local_c8 [7];
  UINT8 mode_1;
  undefined1 local_b0 [8];
  QByteArray pattern_1;
  undefined1 auStack_90 [3];
  UINT8 mode;
  QByteArrayView local_80 [2];
  QString local_60;
  QByteArray local_48;
  undefined1 local_30 [8];
  QByteArray pattern;
  int index;
  UEFITool *this_local;
  
  iVar4 = (**(code **)(*(long *)this->searchDialog + 0x1a8))();
  if (iVar4 == 1) {
    pattern.d.size._4_4_ = QTabWidget::currentIndex();
    if (pattern.d.size._4_4_ == 0) {
      QWidget::setFocus(*(QWidget **)(this->searchDialog->ui + 0x28));
      QLineEdit::text();
      QString::toLatin1(&local_48,&local_60);
      QByteArrayView::QByteArrayView<2ul>(local_80,(char (*) [2])0x2611ef);
      QByteArrayView::QByteArrayView<1ul>
                ((QByteArrayView *)auStack_90,(char (*) [1])(anon_var_dwarf_170ce6 + 0x10));
      QVar5.m_data = _auStack_90;
      QVar5.m_size = (qsizetype)local_80[0].m_data;
      QVar6.m_data = (storage_type *)local_80[0].m_size;
      QVar6.m_size = (qsizetype)&local_48;
      a = (QByteArray *)QByteArray::replace(QVar6,QVar5);
      QByteArray::QByteArray((QByteArray *)local_30,a);
      QByteArray::~QByteArray(&local_48);
      QString::~QString(&local_60);
      bVar1 = QByteArray::isEmpty((QByteArray *)local_30);
      if (bVar1) {
        pattern_1.d.size._4_4_ = 1;
      }
      else {
        bVar2 = QAbstractButton::isChecked();
        if ((bVar2 & 1) == 0) {
          bVar2 = QAbstractButton::isChecked();
          if ((bVar2 & 1) == 0) {
            pattern_1.d.size._3_1_ = '\x03';
          }
          else {
            pattern_1.d.size._3_1_ = '\x02';
          }
        }
        else {
          pattern_1.d.size._3_1_ = '\x01';
        }
        FfsFinder::findHexPattern(this->ffsFinder,(QByteArray *)local_30,pattern_1.d.size._3_1_);
        showFinderMessages(this);
        pattern_1.d.size._4_4_ = 0;
      }
      QByteArray::~QByteArray((QByteArray *)local_30);
    }
    else if (pattern.d.size._4_4_ == 1) {
      QWidget::setFocus(*(QWidget **)(this->searchDialog->ui + 0x70));
      QLineEdit::setCursorPosition((int)*(undefined8 *)(this->searchDialog->ui + 0x70));
      QLineEdit::text();
      QString::toLatin1((QByteArray *)local_b0,(QString *)local_c8);
      QString::~QString((QString *)local_c8);
      bVar1 = QByteArray::isEmpty((QByteArray *)local_b0);
      if (bVar1) {
        pattern_1.d.size._4_4_ = 1;
      }
      else {
        bVar2 = QAbstractButton::isChecked();
        if ((bVar2 & 1) == 0) {
          bVar2 = QAbstractButton::isChecked();
          if ((bVar2 & 1) == 0) {
            pattern_2.d.size._7_1_ = '\x03';
          }
          else {
            pattern_2.d.size._7_1_ = '\x02';
          }
        }
        else {
          pattern_2.d.size._7_1_ = '\x01';
        }
        FfsFinder::findGuidPattern(this->ffsFinder,(QByteArray *)local_b0,pattern_2.d.size._7_1_);
        showFinderMessages(this);
        pattern_1.d.size._4_4_ = 0;
      }
      QByteArray::~QByteArray((QByteArray *)local_b0);
    }
    else if (pattern.d.size._4_4_ == 2) {
      QWidget::setFocus(*(QWidget **)(this->searchDialog->ui + 0xb8));
      QLineEdit::text();
      bVar1 = QString::isEmpty((QString *)local_e8);
      if (bVar1) {
        pattern_1.d.size._4_4_ = 1;
      }
      else {
        bVar2 = QAbstractButton::isChecked();
        if ((bVar2 & 1) == 0) {
          bVar2 = QAbstractButton::isChecked();
          if ((bVar2 & 1) == 0) {
            local_e9 = '\x03';
          }
          else {
            local_e9 = '\x02';
          }
        }
        else {
          local_e9 = '\x01';
        }
        this_00 = this->ffsFinder;
        bVar2 = QAbstractButton::isChecked();
        bVar3 = QAbstractButton::isChecked();
        FfsFinder::findTextPattern
                  (this_00,(QString *)local_e8,local_e9,(bool)(bVar2 & 1),bVar3 & CaseSensitive);
        showFinderMessages(this);
        pattern_1.d.size._4_4_ = 0;
      }
      QString::~QString((QString *)local_e8);
    }
  }
  return;
}

Assistant:

void UEFITool::search()
{
    if (searchDialog->exec() != QDialog::Accepted)
        return;
    
    int index = searchDialog->ui->tabWidget->currentIndex();
    if (index == 0) { // Hex pattern
        searchDialog->ui->hexEdit->setFocus();
        QByteArray pattern = searchDialog->ui->hexEdit->text().toLatin1().replace(" ", "");
        if (pattern.isEmpty())
            return;
        UINT8 mode;
        if (searchDialog->ui->hexScopeHeaderRadioButton->isChecked())
            mode = SEARCH_MODE_HEADER;
        else if (searchDialog->ui->hexScopeBodyRadioButton->isChecked())
            mode = SEARCH_MODE_BODY;
        else
            mode = SEARCH_MODE_ALL;
        ffsFinder->findHexPattern(pattern, mode);
        showFinderMessages();
    }
    else if (index == 1) { // GUID
        searchDialog->ui->guidEdit->setFocus();
        searchDialog->ui->guidEdit->setCursorPosition(0);
        QByteArray pattern = searchDialog->ui->guidEdit->text().toLatin1();
        if (pattern.isEmpty())
            return;
        UINT8 mode;
        if (searchDialog->ui->guidScopeHeaderRadioButton->isChecked())
            mode = SEARCH_MODE_HEADER;
        else if (searchDialog->ui->guidScopeBodyRadioButton->isChecked())
            mode = SEARCH_MODE_BODY;
        else
            mode = SEARCH_MODE_ALL;
        ffsFinder->findGuidPattern(pattern, mode);
        showFinderMessages();
    }
    else if (index == 2) { // Text string
        searchDialog->ui->textEdit->setFocus();
        QString pattern = searchDialog->ui->textEdit->text();
        if (pattern.isEmpty())
            return;
        UINT8 mode;
        if (searchDialog->ui->textScopeHeaderRadioButton->isChecked())
            mode = SEARCH_MODE_HEADER;
        else if (searchDialog->ui->textScopeBodyRadioButton->isChecked())
            mode = SEARCH_MODE_BODY;
        else
            mode = SEARCH_MODE_ALL;
        ffsFinder->findTextPattern(pattern, mode, searchDialog->ui->textUnicodeCheckBox->isChecked(),
                                   (Qt::CaseSensitivity) searchDialog->ui->textCaseSensitiveCheckBox->isChecked());
        showFinderMessages();
    }
}